

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmGlobalUnixMakefileGenerator3::AddCXXCompileCommand
          (cmGlobalUnixMakefileGenerator3 *this,string *sourceFile,string *workingDirectory,
          string *compileCommand)

{
  pointer pcVar1;
  string *psVar2;
  long *plVar3;
  cmGeneratedFileStream *pcVar4;
  ostream *poVar5;
  size_type *psVar6;
  string commandDatabaseName;
  string local_98;
  string local_78;
  string *local_58;
  string local_50;
  
  pcVar4 = this->CommandDatabase;
  if (pcVar4 == (cmGeneratedFileStream *)0x0) {
    psVar2 = cmake::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
    ;
    pcVar1 = (psVar2->_M_dataplus)._M_p;
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar1,pcVar1 + psVar2->_M_string_length);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_98.field_2._M_allocated_capacity = *psVar6;
      local_98.field_2._8_8_ = plVar3[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar6;
      local_98._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_98._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_58 = sourceFile;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    pcVar4 = (cmGeneratedFileStream *)operator_new(0x248);
    cmGeneratedFileStream::cmGeneratedFileStream(pcVar4,&local_98,false,None);
    this->CommandDatabase = pcVar4;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar4,"[",1);
    std::ios::widen((char)(pcVar4->super_ofstream).
                          super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]
                    + (char)pcVar4);
    std::ostream::put((char)pcVar4);
    std::ostream::flush();
    sourceFile = local_58;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      sourceFile = local_58;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar4,",",1);
    std::ios::widen((char)(pcVar4->super_ofstream).
                          super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]
                    + (char)pcVar4);
    std::ostream::put((char)pcVar4);
    std::ostream::flush();
  }
  pcVar4 = this->CommandDatabase;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar4,"{",1);
  std::ios::widen((char)(pcVar4->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream[-3] + (char)pcVar4);
  std::ostream::put((char)pcVar4);
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  \"directory\": \"",0x10);
  cmGlobalGenerator::EscapeJSON(&local_98,workingDirectory);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_98._M_dataplus._M_p,local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\",",2);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  \"command\": \"",0xe);
  cmGlobalGenerator::EscapeJSON(&local_78,compileCommand);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\",",2);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  \"file\": \"",0xb);
  cmGlobalGenerator::EscapeJSON(&local_50,sourceFile);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
  std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
  std::ostream::put((char)poVar5);
  poVar5 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::AddCXXCompileCommand(
  const std::string& sourceFile, const std::string& workingDirectory,
  const std::string& compileCommand)
{
  if (this->CommandDatabase == nullptr) {
    std::string commandDatabaseName =
      std::string(this->GetCMakeInstance()->GetHomeOutputDirectory()) +
      "/compile_commands.json";
    this->CommandDatabase = new cmGeneratedFileStream(commandDatabaseName);
    *this->CommandDatabase << "[" << std::endl;
  } else {
    *this->CommandDatabase << "," << std::endl;
  }
  *this->CommandDatabase << "{" << std::endl
                         << "  \"directory\": \""
                         << cmGlobalGenerator::EscapeJSON(workingDirectory)
                         << "\"," << std::endl
                         << "  \"command\": \""
                         << cmGlobalGenerator::EscapeJSON(compileCommand)
                         << "\"," << std::endl
                         << "  \"file\": \""
                         << cmGlobalGenerator::EscapeJSON(sourceFile) << "\""
                         << std::endl
                         << "}";
}